

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CommandLineInterface::ParseArgument
          (CommandLineInterface *this,char *arg,string *name,string *value)

{
  bool bVar1;
  char *pcVar2;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  if ((*arg == '-') && (arg[1] != '\0')) {
    if (arg[1] == '-') {
      pcVar2 = strchr(arg,0x3d);
      if (pcVar2 != (char *)0x0) {
        local_48[0] = local_38;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_48,arg,pcVar2);
        std::__cxx11::string::operator=((string *)name,(string *)local_48);
        std::__cxx11::string::~string((string *)local_48);
        goto LAB_0026d94b;
      }
      std::__cxx11::string::assign((char *)name);
    }
    else {
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_48,arg,arg + 2);
      std::__cxx11::string::operator=((string *)name,(string *)local_48);
      std::__cxx11::string::~string((string *)local_48);
      std::__cxx11::string::assign((char *)value);
      if (value->_M_string_length != 0) {
        return false;
      }
    }
    bVar1 = std::operator==(name,"-h");
    if ((((!bVar1) && (bVar1 = std::operator==(name,"--help"), !bVar1)) &&
        (bVar1 = std::operator==(name,"--disallow_services"), !bVar1)) &&
       (((bVar1 = std::operator==(name,"--include_imports"), !bVar1 &&
         (bVar1 = std::operator==(name,"--include_source_info"), !bVar1)) &&
        ((bVar1 = std::operator==(name,"--version"), !bVar1 &&
         (bVar1 = std::operator==(name,"--decode_raw"), !bVar1)))))) {
      bVar1 = std::operator==(name,"--print_free_field_numbers");
      return !bVar1;
    }
  }
  else {
    name->_M_string_length = 0;
    *(name->_M_dataplus)._M_p = '\0';
LAB_0026d94b:
    std::__cxx11::string::assign((char *)value);
  }
  return false;
}

Assistant:

bool CommandLineInterface::ParseArgument(const char* arg, std::string* name,
                                         std::string* value) {
  bool parsed_value = false;

  if (arg[0] != '-') {
    // Not a flag.
    name->clear();
    parsed_value = true;
    *value = arg;
  } else if (arg[1] == '-') {
    // Two dashes:  Multi-character name, with '=' separating name and
    //   value.
    const char* equals_pos = strchr(arg, '=');
    if (equals_pos != NULL) {
      *name = std::string(arg, equals_pos - arg);
      *value = equals_pos + 1;
      parsed_value = true;
    } else {
      *name = arg;
    }
  } else {
    // One dash:  One-character name, all subsequent characters are the
    //   value.
    if (arg[1] == '\0') {
      // arg is just "-".  We treat this as an input file, except that at
      // present this will just lead to a "file not found" error.
      name->clear();
      *value = arg;
      parsed_value = true;
    } else {
      *name = std::string(arg, 2);
      *value = arg + 2;
      parsed_value = !value->empty();
    }
  }

  // Need to return true iff the next arg should be used as the value for this
  // one, false otherwise.

  if (parsed_value) {
    // We already parsed a value for this flag.
    return false;
  }

  if (*name == "-h" || *name == "--help" || *name == "--disallow_services" ||
      *name == "--include_imports" || *name == "--include_source_info" ||
      *name == "--version" || *name == "--decode_raw" ||
      *name == "--print_free_field_numbers") {
    // HACK:  These are the only flags that don't take a value.
    //   They probably should not be hard-coded like this but for now it's
    //   not worth doing better.
    return false;
  }

  // Next argument is the flag value.
  return true;
}